

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O3

char * stb_substr(char *t,int n)

{
  size_t sVar1;
  char *__dest;
  
  sVar1 = strlen(t);
  if ((int)sVar1 < n) {
    n = (int)sVar1;
  }
  __dest = (char *)malloc((long)(n + 1));
  strncpy(__dest,t,(long)n);
  __dest[n] = '\0';
  return __dest;
}

Assistant:

char *stb_substr(char *t, int n)
{
   char *a;
   int z = (int) strlen(t);
   if (z < n) n = z;
   a = (char *) malloc(n+1);
   strncpy(a,t,n);
   a[n] = 0;
   return a;
}